

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVector<unsigned_int,_0U>::SmallVector
          (SmallVector<unsigned_int,_0U> *this,SmallVector<unsigned_int,_0U> *RHS)

{
  (this->super_SmallVectorImpl<unsigned_int>).super_SmallVectorTemplateBase<unsigned_int,_true>.
  super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX = this + 1;
  (this->super_SmallVectorImpl<unsigned_int>).super_SmallVectorTemplateBase<unsigned_int,_true>.
  super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size = 0;
  (this->super_SmallVectorImpl<unsigned_int>).super_SmallVectorTemplateBase<unsigned_int,_true>.
  super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Capacity = 0;
  if ((RHS->super_SmallVectorImpl<unsigned_int>).super_SmallVectorTemplateBase<unsigned_int,_true>.
      super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size != 0) {
    SmallVectorImpl<unsigned_int>::operator=
              (&this->super_SmallVectorImpl<unsigned_int>,&RHS->super_SmallVectorImpl<unsigned_int>)
    ;
  }
  return;
}

Assistant:

SmallVector(SmallVector &&RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(::std::move(RHS));
  }